

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_multi_file_info.cpp
# Opt level: O3

shared_ptr<duckdb::BaseUnionData,_true> __thiscall
duckdb::CSVMultiFileInfo::GetUnionData
          (CSVMultiFileInfo *this,shared_ptr<duckdb::BaseFileReader,_true> *scan_p,idx_t file_idx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  BaseFileReader *pBVar3;
  BaseFileReader *pBVar4;
  CSVUnionData *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::BaseUnionData,_true> sVar6;
  undefined1 local_49;
  shared_ptr<duckdb::CSVUnionData,_true> local_48;
  CSVUnionData *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  pBVar3 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(scan_p);
  pBVar4 = shared_ptr<duckdb::BaseFileReader,_true>::operator->(scan_p);
  local_38 = (CSVUnionData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVUnionData,std::allocator<duckdb::CSVUnionData>,duckdb::OpenFileInfo&>
            (&local_30,&local_38,(allocator<duckdb::CSVUnionData> *)&local_49,&pBVar4->file);
  local_48.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  local_48.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = local_30._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_30._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00b9f0c5;
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
LAB_00b9f0c5:
  if (file_idx == 0) {
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    CSVReaderOptions::operator=
              (&pCVar5->options,(CSVReaderOptions *)&pBVar3[1].expression_map._M_h._M_element_count)
    ;
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pCVar5->super_BaseUnionData).names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pBVar3[6].file.path._M_string_length);
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(pCVar5->super_BaseUnionData).types,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &pBVar3[6].file.extended_info);
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    peVar1 = (scan_p->internal).
             super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (scan_p->internal).
             super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    (scan_p->internal).super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    (scan_p->internal).super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pCVar5->super_BaseUnionData).reader.internal.
              super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (pCVar5->super_BaseUnionData).reader.internal.
    super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    (pCVar5->super_BaseUnionData).reader.internal.
    super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    CSVReaderOptions::operator=
              (&pCVar5->options,(CSVReaderOptions *)&pBVar3[1].expression_map._M_h._M_element_count)
    ;
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pCVar5->super_BaseUnionData).names,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pBVar3[6].file.path._M_string_length);
    pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(pCVar5->super_BaseUnionData).types,
               (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &pBVar3[6].file.extended_info);
  }
  pCVar5 = shared_ptr<duckdb::CSVUnionData,_true>::operator->(&local_48);
  (pCVar5->options).auto_detect = false;
  *(element_type **)this =
       local_48.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
       local_48.internal.super___shared_ptr<duckdb::CSVUnionData,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BaseUnionData,_true>)
         sVar6.internal.super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BaseUnionData> CSVMultiFileInfo::GetUnionData(shared_ptr<BaseFileReader> scan_p, idx_t file_idx) {
	auto &scan = scan_p->Cast<CSVFileScan>();
	auto data = make_shared_ptr<CSVUnionData>(scan_p->file);
	if (file_idx == 0) {
		data->options = scan.options;
		data->names = scan.GetNames();
		data->types = scan.GetTypes();
		data->reader = std::move(scan_p);
	} else {
		data->options = std::move(scan.options);
		data->names = scan.GetNames();
		data->types = scan.GetTypes();
	}
	data->options.auto_detect = false;
	return data;
}